

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Counter.cxx
# Opt level: O0

int __thiscall Fl_Counter::handle(Fl_Counter *this,int event)

{
  int iVar1;
  double dVar2;
  Fl_Widget_Tracker local_40;
  Fl_Widget_Tracker wp_1;
  Fl_Widget_Tracker local_28;
  Fl_Widget_Tracker wp;
  int i;
  int event_local;
  Fl_Counter *this_local;
  
  wp.wp_._4_4_ = event;
  switch(event) {
  case 1:
    iVar1 = Fl::visible_focus();
    if (iVar1 != 0) {
      Fl::focus((Fl_Widget *)this);
    }
    Fl_Widget_Tracker::Fl_Widget_Tracker(&local_28,(Fl_Widget *)this);
    Fl_Valuator::handle_push(&this->super_Fl_Valuator);
    iVar1 = Fl_Widget_Tracker::deleted(&local_28);
    if (iVar1 != 0) {
      this_local._4_4_ = 1;
    }
    wp_1.wp_._1_3_ = 0;
    wp_1.wp_._0_1_ = iVar1 != 0;
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_28);
    if ((uint)wp_1.wp_ != 0) {
      return this_local._4_4_;
    }
  case 5:
    wp.wp_._0_4_ = calc_mouseobj(this);
    if ((uint)wp.wp_ != this->mouseobj) {
      Fl::remove_timeout(repeat_callback,this);
      this->mouseobj = (uchar)(uint)wp.wp_;
      if ((uint)wp.wp_ != 0) {
        Fl::add_timeout(0.5,repeat_callback,this);
      }
      Fl_Widget_Tracker::Fl_Widget_Tracker(&local_40,(Fl_Widget *)this);
      increment_cb(this);
      iVar1 = Fl_Widget_Tracker::deleted(&local_40);
      if (iVar1 == 0) {
        Fl_Widget::redraw((Fl_Widget *)this);
      }
      else {
        this_local._4_4_ = 1;
      }
      wp_1.wp_._1_3_ = 0;
      wp_1.wp_._0_1_ = iVar1 != 0;
      Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_40);
      if ((uint)wp_1.wp_ != 0) {
        return this_local._4_4_;
      }
    }
    this_local._4_4_ = 1;
    break;
  case 2:
    if (this->mouseobj != '\0') {
      Fl::remove_timeout(repeat_callback,this);
      this->mouseobj = '\0';
      Fl_Widget::redraw((Fl_Widget *)this);
    }
    Fl_Valuator::handle_release(&this->super_Fl_Valuator);
    this_local._4_4_ = 1;
    break;
  case 3:
  case 4:
    this_local._4_4_ = 1;
    break;
  case 6:
  case 7:
    iVar1 = Fl::visible_focus();
    if (iVar1 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      Fl_Widget::redraw((Fl_Widget *)this);
      this_local._4_4_ = 1;
    }
    break;
  case 8:
    iVar1 = Fl::event_key();
    if (iVar1 == 0xff51) {
      dVar2 = Fl_Valuator::value(&this->super_Fl_Valuator);
      dVar2 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar2,-1);
      dVar2 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar2);
      Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar2);
      this_local._4_4_ = 1;
    }
    else if (iVar1 == 0xff53) {
      dVar2 = Fl_Valuator::value(&this->super_Fl_Valuator);
      dVar2 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar2,1);
      dVar2 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar2);
      Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar2);
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 0;
    }
    break;
  default:
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Counter::handle(int event) {
  int i;
  switch (event) {
  case FL_RELEASE:
    if (mouseobj) {
      Fl::remove_timeout(repeat_callback, this);
      mouseobj = 0;
      redraw();
    }
    handle_release();
    return 1;
  case FL_PUSH:
    if (Fl::visible_focus()) Fl::focus(this);
    { Fl_Widget_Tracker wp(this);
      handle_push();
      if (wp.deleted()) return 1;
    }
  case FL_DRAG:
    i = calc_mouseobj();
    if (i != mouseobj) {
      Fl::remove_timeout(repeat_callback, this);
      mouseobj = (uchar)i;
      if (i) Fl::add_timeout(INITIALREPEAT, repeat_callback, this);
      Fl_Widget_Tracker wp(this);
      increment_cb();
      if (wp.deleted()) return 1;
      redraw();
    }
    return 1;
  case FL_KEYBOARD :
    switch (Fl::event_key()) {
      case FL_Left:
	handle_drag(clamp(increment(value(),-1)));
	return 1;
      case FL_Right:
	handle_drag(clamp(increment(value(),1)));
	return 1;
      default:
        return 0;
    }
    // break not required because of switch...
  case FL_FOCUS : /* FALLTHROUGH */
  case FL_UNFOCUS :
    if (Fl::visible_focus()) {
      redraw();
      return 1;
    } else return 0;
  case FL_ENTER : /* FALLTHROUGH */
  case FL_LEAVE :
    return 1;
  default:
    return 0;
  }
}